

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

bool __thiscall cmLocalGenerator::CheckDefinition(cmLocalGenerator *this,string *define)

{
  long lVar1;
  ostream *poVar2;
  string sStack_1a8;
  ostringstream e;
  
  lVar1 = std::__cxx11::string::find_first_of((char *)define,0x5a3baa);
  if ((lVar1 == -1) || ((define->_M_dataplus)._M_p[lVar1] != '(')) {
    lVar1 = std::__cxx11::string::find((char)define,0x23);
    if (lVar1 == -1) {
      return true;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    poVar2 = std::operator<<((ostream *)&e,
                             "WARNING: Preprocessor definitions containing \'#\' may not be ");
    poVar2 = std::operator<<(poVar2,"passed on the compiler command line because many compilers ");
    poVar2 = std::operator<<(poVar2,"do not support it.\n");
    poVar2 = std::operator<<(poVar2,"CMake is dropping a preprocessor definition: ");
    poVar2 = std::operator<<(poVar2,(string *)define);
    poVar2 = std::operator<<(poVar2,"\n");
    std::operator<<(poVar2,"Consider defining the macro in a (configured) header file.\n");
    std::__cxx11::stringbuf::str();
    cmSystemTools::Message(&sStack_1a8,(char *)0x0);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    poVar2 = std::operator<<((ostream *)&e,
                             "WARNING: Function-style preprocessor definitions may not be ");
    poVar2 = std::operator<<(poVar2,"passed on the compiler command line because many compilers ");
    poVar2 = std::operator<<(poVar2,"do not support it.\n");
    poVar2 = std::operator<<(poVar2,"CMake is dropping a preprocessor definition: ");
    poVar2 = std::operator<<(poVar2,(string *)define);
    poVar2 = std::operator<<(poVar2,"\n");
    std::operator<<(poVar2,"Consider defining the macro in a (configured) header file.\n");
    std::__cxx11::stringbuf::str();
    cmSystemTools::Message(&sStack_1a8,(char *)0x0);
  }
  std::__cxx11::string::~string((string *)&sStack_1a8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
  return false;
}

Assistant:

bool cmLocalGenerator::CheckDefinition(std::string const& define) const
{
  // Many compilers do not support -DNAME(arg)=sdf so we disable it.
  std::string::size_type pos = define.find_first_of("(=");
  if (pos != std::string::npos) {
    if (define[pos] == '(') {
      std::ostringstream e;
      /* clang-format off */
      e << "WARNING: Function-style preprocessor definitions may not be "
        << "passed on the compiler command line because many compilers "
        << "do not support it.\n"
        << "CMake is dropping a preprocessor definition: " << define << "\n"
        << "Consider defining the macro in a (configured) header file.\n";
      /* clang-format on */
      cmSystemTools::Message(e.str());
      return false;
    }
  }

  // Many compilers do not support # in the value so we disable it.
  if (define.find_first_of('#') != std::string::npos) {
    std::ostringstream e;
    /* clang-format off */
    e << "WARNING: Preprocessor definitions containing '#' may not be "
      << "passed on the compiler command line because many compilers "
      << "do not support it.\n"
      << "CMake is dropping a preprocessor definition: " << define << "\n"
      << "Consider defining the macro in a (configured) header file.\n";
    /* clang-format on */
    cmSystemTools::Message(e.str());
    return false;
  }

  // Assume it is supported.
  return true;
}